

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O0

void __thiscall
FIX::shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::release(shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  atomic<long> *tmpCounter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tmpBuff;
  shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  bVar2 = empty(this);
  if ((!bVar2) && (lVar3 = decrement_reference_count(this), lVar3 == 0)) {
    pbVar1 = this->m_buffer;
    get_counter(this);
    this->m_buffer = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    this->m_size = 0;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar3 = *(long *)((long)&pbVar1[-1].field_2 + 8);
      this_00 = pbVar1 + lVar3;
      while (pbVar1 != this_00) {
        this_00 = this_00 + -1;
        std::__cxx11::string::~string((string *)this_00);
      }
      operator_delete__((void *)((long)&pbVar1[-1].field_2 + 8),lVar3 * 0x20 + 8);
    }
  }
  return;
}

Assistant:

void release() {
    if (empty()) {
      return;
    }

    // free object if reference count has decreased to zero
    if (decrement_reference_count() == 0) {
      T *tmpBuff = m_buffer;
      std::atomic<long> *tmpCounter = get_counter();

      m_buffer = 0;
      m_size = 0;

      // explicitly call destructor for the counter object
      tmpCounter->~atomic<long>();

      delete[] tmpBuff;
    }
  }